

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::coalesceContentStreams(QPDFObjectHandle *this)

{
  bool bVar1;
  QPDF *qpdf_00;
  CoalesceProvider *this_00;
  QPDFObjectHandle local_128;
  QPDFObjectHandle local_118;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> local_108;
  undefined1 local_f1;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  undefined1 local_d0 [8];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  string local_b8;
  undefined1 local_98 [8];
  QPDFObjectHandle new_contents;
  string local_80;
  QPDF *local_60;
  QPDF *qpdf;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  QPDFObjectHandle contents;
  QPDFObjectHandle *this_local;
  
  contents.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/Contents",&local_41);
  getKey((QPDFObjectHandle *)local_20,(string *)this);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = isStream((QPDFObjectHandle *)local_20);
  if (bVar1) {
    QTC::TC("qpdf","QPDFObjectHandle coalesce called on stream",0);
    qpdf._0_4_ = 1;
  }
  else {
    bVar1 = isArray((QPDFObjectHandle *)local_20);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,
                 "coalesceContentStreams called on object  with no associated PDF file",
                 (allocator<char> *)
                 ((long)&new_contents.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      qpdf_00 = getQPDF(this,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&new_contents.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      local_60 = qpdf_00;
      newStream((QPDFObjectHandle *)local_98,qpdf_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"/Contents",
                 (allocator<char> *)
                 ((long)&provider.
                         super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      replaceKey(this,&local_b8,(QPDFObjectHandle *)local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&provider.
                         super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      this_00 = (CoalesceProvider *)operator_new(0x30);
      local_f1 = 1;
      QPDFObjectHandle(&local_e0,this);
      QPDFObjectHandle(&local_f0,(QPDFObjectHandle *)local_20);
      anon_unknown.dwarf_39bb6a::CoalesceProvider::CoalesceProvider(this_00,&local_e0,&local_f0);
      local_f1 = 0;
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::
      shared_ptr<(anonymous_namespace)::CoalesceProvider,void>
                ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_d0,this_00);
      ~QPDFObjectHandle(&local_f0);
      ~QPDFObjectHandle(&local_e0);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr
                (&local_108,(shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_d0);
      newNull();
      newNull();
      replaceStreamData((QPDFObjectHandle *)local_98,&local_108,&local_118,&local_128);
      ~QPDFObjectHandle(&local_128);
      ~QPDFObjectHandle(&local_118);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr(&local_108);
      std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::~shared_ptr
                ((shared_ptr<QPDFObjectHandle::StreamDataProvider> *)local_d0);
      ~QPDFObjectHandle((QPDFObjectHandle *)local_98);
      qpdf._0_4_ = 0;
    }
    else {
      qpdf._0_4_ = 1;
    }
  }
  ~QPDFObjectHandle((QPDFObjectHandle *)local_20);
  return;
}

Assistant:

void
QPDFObjectHandle::coalesceContentStreams()
{
    QPDFObjectHandle contents = this->getKey("/Contents");
    if (contents.isStream()) {
        QTC::TC("qpdf", "QPDFObjectHandle coalesce called on stream");
        return;
    } else if (!contents.isArray()) {
        // /Contents is optional for pages, and some very damaged files may have pages that are
        // invalid in other ways.
        return;
    }
    // Should not be possible for a page object to not have an owning PDF unless it was manually
    // constructed in some incorrect way. However, it can happen in a PDF file whose page structure
    // is direct, which is against spec but still possible to hand construct, as in fuzz issue
    // 27393.
    QPDF& qpdf = getQPDF("coalesceContentStreams called on object  with no associated PDF file");

    QPDFObjectHandle new_contents = newStream(&qpdf);
    this->replaceKey("/Contents", new_contents);

    auto provider = std::shared_ptr<StreamDataProvider>(new CoalesceProvider(*this, contents));
    new_contents.replaceStreamData(provider, newNull(), newNull());
}